

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

int mpz_div_qr(__mpz_struct *q,__mpz_struct *r,__mpz_struct *n,__mpz_struct *d,
              mpz_div_round_mode mode)

{
  mp_limb_t *pmVar1;
  bool bVar2;
  mp_srcptr pmVar3;
  __mpz_struct *b;
  __mpz_struct *p_Var4;
  undefined8 uVar5;
  mp_limb_t mVar6;
  mp_ptr pmVar7;
  mp_limb_t *pmVar8;
  uint uVar9;
  ulong nn;
  __mpz_struct *p_Var10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong dn;
  __mpz_struct local_b8;
  __mpz_struct local_a8;
  mp_limb_t *local_98;
  __mpz_struct *local_90;
  mpz_div_round_mode local_84;
  mp_srcptr local_80;
  mp_srcptr local_78;
  __mpz_struct *local_70;
  long local_68;
  ulong local_60;
  __mpz_struct *local_58;
  gmp_div_inverse local_50;
  
  uVar14 = (ulong)d->_mp_size;
  if (uVar14 != 0) {
    uVar9 = n->_mp_size;
    local_60 = (ulong)(int)uVar9;
    if (uVar9 == 0) {
      if (q != (__mpz_struct *)0x0) {
        q->_mp_size = 0;
      }
      uVar9 = 0;
      if (r != (__mpz_struct *)0x0) {
        r->_mp_size = 0;
      }
    }
    else {
      nn = -local_60;
      if (0 < (long)local_60) {
        nn = local_60;
      }
      dn = -uVar14;
      if (0 < (long)uVar14) {
        dn = uVar14;
      }
      uVar9 = d->_mp_size ^ uVar9;
      lVar12 = nn - dn;
      if (nn < dn) {
        if ((int)uVar9 < 0 || mode != GMP_DIV_CEIL) {
          if (-1 < (int)uVar9 || mode != GMP_DIV_FLOOR) {
            if (r != (__mpz_struct *)0x0) {
              mpz_set(r,n);
            }
            if (q == (__mpz_struct *)0x0) {
              return 1;
            }
            q->_mp_size = 0;
            return 1;
          }
          if (r != (__mpz_struct *)0x0) {
            mpz_add(r,n,d);
          }
          if (q == (__mpz_struct *)0x0) {
            return 1;
          }
          q->_mp_size = -1;
        }
        else {
          if (r != (__mpz_struct *)0x0) {
            mpz_sub(r,n,d);
          }
          if (q == (__mpz_struct *)0x0) {
            return 1;
          }
          q->_mp_size = 1;
        }
        uVar9 = 1;
        if (q->_mp_alloc < 1) {
          pmVar7 = mpz_realloc(q,1);
        }
        else {
          pmVar7 = q->_mp_d;
        }
        *pmVar7 = 1;
      }
      else {
        local_b8._mp_alloc = 0;
        local_b8._mp_size = 0;
        local_b8._mp_d = &mpz_init::dummy_limb;
        local_90 = q;
        local_84 = mode;
        local_70 = d;
        local_58 = r;
        mpz_set(&local_b8,n);
        pmVar1 = local_b8._mp_d;
        lVar13 = lVar12 + 1;
        local_68 = lVar12;
        if (local_90 == (__mpz_struct *)0x0) {
          local_98 = (mp_limb_t *)0x0;
        }
        else {
          lVar12 = 0x3ffffffffffffff;
          if (lVar13 == 0) {
            lVar12 = 0;
          }
          uVar14 = lVar12 + lVar13 & 0x3ffffffffffffff;
          local_a8._mp_alloc = (int)uVar14 + 1;
          local_a8._mp_size = 0;
          local_a8._mp_d = (mp_limb_t *)(*gmp_allocate_func)(uVar14 * 8 + 8);
          local_98 = local_a8._mp_d;
        }
        local_78 = local_70->_mp_d;
        mpn_div_qr_invert(&local_50,local_78,dn);
        pmVar8 = local_98;
        if (dn < 3 || local_50.shift == 0) {
          mpn_div_qr_preinv(local_98,pmVar1,nn,local_78,dn,&local_50);
          p_Var10 = local_90;
        }
        else {
          local_80 = (mp_srcptr)(*gmp_allocate_func)(dn * 8);
          mVar6 = mpn_lshift(local_80,local_78,dn,local_50.shift);
          pmVar3 = local_80;
          pmVar8 = local_98;
          if (mVar6 != 0) goto LAB_001038ac;
          mpn_div_qr_preinv(local_98,pmVar1,nn,local_80,dn,&local_50);
          p_Var10 = local_90;
          if (pmVar3 != (mp_srcptr)0x0) {
            (*gmp_free_func)(local_80,0);
          }
        }
        p_Var4 = local_58;
        b = local_70;
        if (pmVar8 != (mp_ptr)0x0) {
          iVar11 = (int)lVar13 - (uint)(pmVar8[local_68] == 0);
          local_a8._mp_size = -iVar11;
          if (-1 < (int)uVar9) {
            local_a8._mp_size = iVar11;
          }
        }
        do {
          if (pmVar1[dn - 1] != 0) goto LAB_00103745;
          bVar2 = 1 < (long)dn;
          dn = dn - 1;
        } while (bVar2);
        dn = 0;
LAB_00103745:
        iVar11 = -(int)dn;
        if (-1 < (int)local_60) {
          iVar11 = (int)dn;
        }
        local_b8._mp_size = iVar11;
        if (((int)uVar9 < 0 && local_84 == GMP_DIV_FLOOR) && dn != 0) {
          if (p_Var10 != (__mpz_struct *)0x0) {
            mpz_sub_ui(&local_a8,&local_a8,1);
          }
          if (p_Var4 != (__mpz_struct *)0x0) {
            mpz_add(&local_b8,&local_b8,b);
          }
        }
        else if ((-1 < (int)uVar9 && local_84 == GMP_DIV_CEIL) && dn != 0) {
          if (p_Var10 != (__mpz_struct *)0x0) {
            mpz_add_ui(&local_a8,&local_a8,1);
          }
          if (p_Var4 != (__mpz_struct *)0x0) {
            mpz_sub(&local_b8,&local_b8,b);
          }
        }
        if (p_Var10 != (__mpz_struct *)0x0) {
          iVar11 = p_Var10->_mp_alloc;
          p_Var10->_mp_alloc = local_a8._mp_alloc;
          p_Var10->_mp_size = local_a8._mp_size;
          pmVar1 = p_Var10->_mp_d;
          p_Var10->_mp_d = local_a8._mp_d;
          if (iVar11 != 0) {
            (*gmp_free_func)(pmVar1,0);
          }
        }
        iVar11 = local_b8._mp_alloc;
        uVar5 = local_b8._0_8_;
        if (p_Var4 != (__mpz_struct *)0x0) {
          uVar5._0_4_ = p_Var4->_mp_alloc;
          uVar5._4_4_ = p_Var4->_mp_size;
          p_Var4->_mp_size = local_b8._mp_size;
          p_Var4->_mp_alloc = local_b8._mp_alloc;
          pmVar1 = p_Var4->_mp_d;
          p_Var4->_mp_d = local_b8._mp_d;
          iVar11 = (int)uVar5;
          local_b8._mp_d = pmVar1;
        }
        local_b8._0_8_ = uVar5;
        if (iVar11 != 0) {
          (*gmp_free_func)(local_b8._mp_d,0);
        }
        uVar9 = (uint)(dn != 0);
      }
    }
    return uVar9;
  }
  mpz_div_qr_cold_1();
LAB_001038ac:
  __assert_fail("__cy == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x480,"void mpn_div_qr(mp_ptr, mp_ptr, mp_size_t, mp_srcptr, mp_size_t)");
}

Assistant:

static int
mpz_div_qr (mpz_t q, mpz_t r,
	    const mpz_t n, const mpz_t d, enum mpz_div_round_mode mode)
{
  mp_size_t ns, ds, nn, dn, qs;
  ns = n->_mp_size;
  ds = d->_mp_size;

  if (ds == 0)
    gmp_die("mpz_div_qr: Divide by zero.");

  if (ns == 0)
    {
      if (q)
	q->_mp_size = 0;
      if (r)
	r->_mp_size = 0;
      return 0;
    }

  nn = GMP_ABS (ns);
  dn = GMP_ABS (ds);

  qs = ds ^ ns;

  if (nn < dn)
    {
      if (mode == GMP_DIV_CEIL && qs >= 0)
	{
	  /* q = 1, r = n - d */
	  if (r)
	    mpz_sub (r, n, d);
	  if (q)
	    mpz_set_ui (q, 1);
	}
      else if (mode == GMP_DIV_FLOOR && qs < 0)
	{
	  /* q = -1, r = n + d */
	  if (r)
	    mpz_add (r, n, d);
	  if (q)
	    mpz_set_si (q, -1);
	}
      else
	{
	  /* q = 0, r = d */
	  if (r)
	    mpz_set (r, n);
	  if (q)
	    q->_mp_size = 0;
	}
      return 1;
    }
  else
    {
      mp_ptr np, qp;
      mp_size_t qn, rn;
      mpz_t tq, tr;

      mpz_init_set (tr, n);
      np = tr->_mp_d;

      qn = nn - dn + 1;

      if (q)
	{
	  mpz_init2 (tq, qn * GMP_LIMB_BITS);
	  qp = tq->_mp_d;
	}
      else
	qp = NULL;

      mpn_div_qr (qp, np, nn, d->_mp_d, dn);

      if (qp)
	{
	  qn -= (qp[qn-1] == 0);

	  tq->_mp_size = qs < 0 ? -qn : qn;
	}
      rn = mpn_normalized_size (np, dn);
      tr->_mp_size = ns < 0 ? - rn : rn;

      if (mode == GMP_DIV_FLOOR && qs < 0 && rn != 0)
	{
	  if (q)
	    mpz_sub_ui (tq, tq, 1);
	  if (r)
	    mpz_add (tr, tr, d);
	}
      else if (mode == GMP_DIV_CEIL && qs >= 0 && rn != 0)
	{
	  if (q)
	    mpz_add_ui (tq, tq, 1);
	  if (r)
	    mpz_sub (tr, tr, d);
	}

      if (q)
	{
	  mpz_swap (tq, q);
	  mpz_clear (tq);
	}
      if (r)
	mpz_swap (tr, r);

      mpz_clear (tr);

      return rn != 0;
    }
}